

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O3

ENUM__mathml__cn__type
COLLADASaxFWL15::toEnum_ENUM__mathml__cn__type
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__cn__type> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  long lVar2;
  
  SVar1 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  lVar2 = 8;
  do {
    if (*(StringHash *)((long)enumMap + lVar2 + -8) == SVar1) {
      *failed = false;
      return *(ENUM__mathml__cn__type *)((long)&enumMap->first + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x78);
  *failed = true;
  return ENUM__mathml__cn__type__COUNT;
}

Assistant:

ENUM__mathml__cn__type toEnum_ENUM__mathml__cn__type (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__mathml__cn__type>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__mathml__cn__type, StringHash, ENUM__mathml__cn__type__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}